

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_misc.c
# Opt level: O2

int luaopen_misc(lua_State *L)

{
  luaM_sysprof_set_writer(buffer_writer_default);
  luaM_sysprof_set_on_stop(on_stop_cb_default);
  luaM_sysprof_set_backtracer((luam_Sysprof_backtracer)0x0);
  lj_lib_register(L,"misc",lj_lib_init_misc,lj_lib_cf_misc);
  lj_lib_register(L,"misc.memprof",lj_lib_init_misc_memprof,lj_lib_cf_misc_memprof);
  lj_lib_register(L,"misc.sysprof",lj_lib_init_misc_sysprof,lj_lib_cf_misc_sysprof);
  return 1;
}

Assistant:

LUALIB_API int luaopen_misc(struct lua_State *L)
{
#if !LJ_TARGET_WINDOWS
  luaM_sysprof_set_writer(buffer_writer_default);
  luaM_sysprof_set_on_stop(on_stop_cb_default);
  /*
  ** XXX: Passing NULL to the backtracer configuration handle sets the default
  ** backtracing function.
  */
  luaM_sysprof_set_backtracer(NULL);
#endif /* !LJ_TARGET_WINDOWS */

  LJ_LIB_REG(L, LUAM_MISCLIBNAME, misc);
#if !LJ_TARGET_WINDOWS
  LJ_LIB_REG(L, LUAM_MISCLIBNAME ".memprof", misc_memprof);
  LJ_LIB_REG(L, LUAM_MISCLIBNAME ".sysprof", misc_sysprof);
#endif /* !LJ_TARGET_WINDOWS */
  return 1;
}